

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonParser.cpp
# Opt level: O3

char __thiscall Json::JsonParser::convert2escape(JsonParser *this,char sn)

{
  undefined3 in_register_00000031;
  int iVar1;
  
  iVar1 = CONCAT31(in_register_00000031,sn);
  if (iVar1 < 0x62) {
    if (iVar1 < 0x3f) {
      if (((iVar1 != 0x22) && (iVar1 != 0x27)) && (iVar1 == 0x30)) {
        return '\0';
      }
    }
    else if (((iVar1 != 0x3f) && (iVar1 != 0x5c)) && (iVar1 == 0x61)) {
      return '\a';
    }
  }
  else {
    switch(iVar1) {
    case 0x6e:
      return '\n';
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x73:
    case 0x75:
      break;
    case 0x72:
      return '\r';
    case 0x74:
      return '\t';
    case 0x76:
      return '\v';
    default:
      if (iVar1 == 0x66) {
        return '\f';
      }
      if (iVar1 == 0x62) {
        return '\b';
      }
    }
  }
  return sn;
}

Assistant:

char Json::JsonParser::convert2escape(char sn) {
    char c;
    switch (sn) {
        case 'a':
            c = '\a';
            break;
        case 'b':
            c = '\b';
            break;
        case 'f':
            c = '\f';
            break;
        case 'r':
            c = '\r';
            break;
        case 't':
            c = '\t';
            break;
        case 'v':
            c = '\v';
            break;
        case '\'':
            c = '\'';
            break;
        case '\"':
            c = '\"';
            break;
        case '?':
            c = '\?';
            break;
        case 'n':
            c = '\n';
            break;
        case '0':
            c = '\0';
            break;
        case '\\':
            c = '\\';
            break;
        default:
            c = sn;
            break;
    }
    return c;
}